

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O1

DdNode * Extra_TransferLevelByLevel(DdManager *ddSource,DdManager *ddDestination,DdNode *f)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  int *piVar4;
  uint uVar5;
  int *Permute;
  ulong uVar6;
  DdNode *pDVar7;
  uint uVar8;
  
  uVar1 = ddDestination->size;
  uVar2 = ddSource->size;
  uVar5 = uVar2;
  if ((int)uVar1 < (int)uVar2) {
    uVar5 = uVar1;
  }
  uVar8 = uVar2;
  if ((int)uVar2 < (int)uVar1) {
    uVar8 = uVar1;
  }
  Permute = (int *)malloc((long)(int)uVar8 << 2);
  if ((int)uVar5 < 1) {
    uVar6 = 0;
  }
  else {
    piVar3 = ddDestination->invperm;
    piVar4 = ddSource->invperm;
    uVar6 = 0;
    do {
      Permute[piVar4[uVar6]] = piVar3[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  if ((int)uVar6 < (int)uVar8 && (int)uVar1 < (int)uVar2) {
    piVar3 = ddSource->invperm;
    uVar6 = uVar6 & 0xffffffff;
    do {
      Permute[piVar3[uVar6]] = -1;
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
  }
  pDVar7 = Extra_TransferPermute(ddSource,ddDestination,f,Permute);
  if (Permute != (int *)0x0) {
    free(Permute);
  }
  return pDVar7;
}

Assistant:

DdNode * Extra_TransferLevelByLevel( DdManager * ddSource, DdManager * ddDestination, DdNode * f )
{
    DdNode * bRes;
    int * pPermute;
    int nMin, nMax, i;

    nMin = ddMin(ddSource->size, ddDestination->size);
    nMax = ddMax(ddSource->size, ddDestination->size);
    pPermute = ABC_ALLOC( int, nMax );
    // set up the variable permutation
    for ( i = 0; i < nMin; i++ )
        pPermute[ ddSource->invperm[i] ] = ddDestination->invperm[i];
    if ( ddSource->size > ddDestination->size )
    {
        for (      ; i < nMax; i++ )
            pPermute[ ddSource->invperm[i] ] = -1;
    }
    bRes = Extra_TransferPermute( ddSource, ddDestination, f, pPermute );
    ABC_FREE( pPermute );
    return bRes;
}